

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDIOAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SDIOAnalyzerResults::GenerateExportFile
          (SDIOAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  ulonglong uVar4;
  ulong uVar5;
  ostream *poVar6;
  ulonglong local_2f8;
  Frame frame;
  ulonglong local_2e8;
  ulonglong local_2e0;
  char local_2d8;
  uint local_2d0;
  undefined4 local_2cc;
  U32 i;
  state current_state;
  U64 num_frames;
  U32 sample_rate;
  U64 trigger_sample;
  char value_str [128];
  ostream local_220 [8];
  ofstream file_stream;
  U32 export_type_user_id_local;
  DisplayBase display_base_local;
  char *file_local;
  SDIOAnalyzerResults *this_local;
  
  std::ofstream::ofstream(local_220,file,_S_out);
  uVar4 = Analyzer::GetTriggerSample();
  uVar3 = Analyzer::GetSampleRate();
  uVar5 = AnalyzerResults::GetNumFrames();
  local_2cc = 0;
  poVar6 = std::operator<<(local_220,"Time[s],IDX,DIR,CMD,ARG1,ARG2,CRC,PASS");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  for (local_2d0 = 0; local_2d0 < uVar5; local_2d0 = local_2d0 + 1) {
    AnalyzerResults::GetFrame((ulonglong)&local_2f8);
    switch(local_2cc) {
    case 0:
      AnalyzerHelpers::GetTimeString(local_2f8,uVar4,uVar3,(char *)&trigger_sample,0x80);
      std::operator<<(local_220,(char *)&trigger_sample);
      poVar6 = std::operator<<(local_220,",");
      std::ostream::operator<<(poVar6,local_2d0);
      if (local_2d8 == '\0') {
        local_2cc = 1;
      }
      else {
        local_2cc = 6;
      }
      break;
    case 1:
      if (local_2d8 == '\0') {
        if (local_2e8 == 0) {
          std::operator<<(local_220,",R");
        }
        else {
          std::operator<<(local_220,",C");
        }
        local_2cc = 2;
      }
      else {
        local_2cc = 6;
      }
      break;
    case 2:
      if (local_2d8 == '\x01') {
        AnalyzerHelpers::GetNumberString(local_2e8,Decimal,6,(char *)&trigger_sample,0x80);
        poVar6 = std::operator<<(local_220,",");
        std::operator<<(poVar6,(char *)&trigger_sample);
        local_2cc = 3;
      }
      else {
        local_2cc = 6;
      }
      break;
    case 3:
      if (local_2d8 == '\x02') {
        AnalyzerHelpers::GetNumberString(local_2e8,display_base,0x20,(char *)&trigger_sample,0x80);
        poVar6 = std::operator<<(local_220,",");
        std::operator<<(poVar6,(char *)&trigger_sample);
        std::operator<<(local_220,",");
      }
      else {
        if (local_2d8 == '\x03') {
          AnalyzerHelpers::GetNumberString(local_2e8,display_base,0x40,(char *)&trigger_sample,0x80)
          ;
          poVar6 = std::operator<<(local_220,",");
          std::operator<<(poVar6,(char *)&trigger_sample);
          AnalyzerHelpers::GetNumberString(local_2e0,display_base,0x40,(char *)&trigger_sample,0x80)
          ;
          poVar6 = std::operator<<(local_220,",");
          std::operator<<(poVar6,(char *)&trigger_sample);
          goto switchD_0010e258_caseD_4;
        }
        local_2cc = 6;
      }
      break;
    case 4:
switchD_0010e258_caseD_4:
      if (local_2d8 == '\x04') {
        AnalyzerHelpers::GetNumberString(local_2e8,display_base,7,(char *)&trigger_sample,0x80);
        poVar6 = std::operator<<(local_220,",");
        std::operator<<(poVar6,(char *)&trigger_sample);
        if (local_2e0 == 0) {
          std::operator<<(local_220,",0");
        }
        else {
          std::operator<<(local_220,",1");
        }
        local_2cc = 5;
      }
      else {
        local_2cc = 6;
      }
      break;
    case 5:
      std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
      bVar2 = AnalyzerResults::UpdateExportProgressAndCheckForCancel
                        ((ulonglong)this,(ulong)local_2d0);
      if ((bVar2 & 1) == 0) {
        local_2cc = 0;
        break;
      }
      std::ofstream::close();
      bVar1 = true;
      goto LAB_0010e6b1;
    case 6:
      std::operator<<(local_220,",ERROR");
      local_2cc = 5;
      break;
    default:
      local_2cc = 6;
    }
    bVar1 = false;
LAB_0010e6b1:
    Frame::~Frame((Frame *)&local_2f8);
    if (bVar1) goto LAB_0010e6f7;
  }
  std::ofstream::close();
LAB_0010e6f7:
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void SDIOAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );
    char value_str[ 128 ];
    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();
    U64 num_frames = GetNumFrames();
    enum state
    {
        STATE_START,
        STATE_DIR,
        STATE_CMD,
        STATE_ARG,
        STATE_CRC,
        STATE_END,
        STATE_ERR,
    } current_state = STATE_START;

    file_stream << "Time[s],IDX,DIR,CMD,ARG1,ARG2,CRC,PASS" << std::endl;

    for( U32 i = 0; i < num_frames; i++ )
    {
        Frame frame = GetFrame( i );

        switch( current_state )
        {
        case STATE_START:
            AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, value_str, 128 );

            file_stream << value_str;

            file_stream << "," << i;

            if( frame.mType != SDIOAnalyzer::FRAME_DIR )
            {
                current_state = STATE_ERR;
                break;
            }

            current_state = STATE_DIR;
            break;

        case STATE_DIR:
            if( frame.mType != SDIOAnalyzer::FRAME_DIR )
            {
                current_state = STATE_ERR;
                break;
            }
            if( frame.mData1 )
            {
                file_stream << ",C";
            }
            else
            {
                file_stream << ",R";
            }
            current_state = STATE_CMD;
            break;

        case STATE_CMD:
            if( frame.mType != SDIOAnalyzer::FRAME_CMD )
            {
                current_state = STATE_ERR;
                break;
            }
            AnalyzerHelpers::GetNumberString( frame.mData1, Decimal, 6, value_str, 128 );
            file_stream << "," << value_str;
            current_state = STATE_ARG;
            break;

        case STATE_ARG:
            if( frame.mType == SDIOAnalyzer::FRAME_ARG )
            {
                AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 32, value_str, 128 );
                file_stream << "," << value_str;
                file_stream << ",";
                break;
            }
            else if( frame.mType == SDIOAnalyzer::FRAME_LONG_ARG )
            {
                AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 64, value_str, 128 );
                file_stream << "," << value_str;

                AnalyzerHelpers::GetNumberString( frame.mData2, display_base, 64, value_str, 128 );
                file_stream << "," << value_str;
            }
            else
            {
                current_state = STATE_ERR;
                break;
            }
            current_state = STATE_CRC;

        case STATE_CRC:
            if( frame.mType != SDIOAnalyzer::FRAME_CRC )
            {
                current_state = STATE_ERR;
                break;
            }

            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 7, value_str, 128 );
            file_stream << "," << value_str;
            if( frame.mData2 )
            {
                file_stream << ",1";
            }
            else
            {
                file_stream << ",0";
            }
            current_state = STATE_END;
            break;

        case STATE_END:
            file_stream << std::endl;

            if( UpdateExportProgressAndCheckForCancel( i, num_frames ) )
            {
                file_stream.close();
                return;
            }
            current_state = STATE_START;
            break;

        case STATE_ERR:
            file_stream << ",ERROR";
            current_state = STATE_END;
            break;

        default:
            current_state = STATE_ERR;
            break;
        }
    }

    file_stream.close();
}